

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void add_csc_range_penalty<PredictionData<float,unsigned_long>>
               (WorkerForPredictCSC *workspace,PredictionData<float,_unsigned_long> *prediction_data
               ,double *weights_arr,size_t col_num,double range_low,double range_high)

{
  ulong *puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  size_t sVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  unsigned_long *puVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  double dVar14;
  
  puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (puVar2 + workspace->st,puVar2 + workspace->end + 1);
  uVar13 = prediction_data->Xc_indptr[col_num];
  uVar3 = prediction_data->Xc_indptr[col_num + 1];
  uVar4 = prediction_data->Xc_ind[uVar3 - 1];
  puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + workspace->st,puVar2 + workspace->end + 1,
                      prediction_data->Xc_ind + uVar13);
  if ((0.0 < range_low) || (range_high < 0.0)) {
    uVar12 = workspace->st;
    uVar11 = workspace->end;
    if (weights_arr == (double *)0x0) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
        uVar7 = puVar2[uVar12];
        pdVar6[uVar7] = pdVar6[uVar7] + -1.0;
      }
    }
    else {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
        uVar7 = puVar2[uVar12];
        pdVar6[uVar7] = pdVar6[uVar7] - weights_arr[uVar7];
      }
    }
    do {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((puVar9 == puVar2 + uVar11 + 1) || (uVar13 == uVar3)) ||
         (uVar12 = *puVar9, uVar4 < uVar12)) {
        return;
      }
      puVar10 = prediction_data->Xc_ind;
      puVar1 = puVar10 + uVar13;
      uVar8 = *puVar1;
      if (uVar8 == uVar12) {
        if ((NAN(prediction_data->Xc[uVar13])) ||
           ((dVar14 = (double)prediction_data->Xc[uVar13], range_low <= dVar14 &&
            (dVar14 <= range_high)))) {
          dVar14 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar14 = weights_arr[uVar12];
          }
          pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6[uVar12] = dVar14 + pdVar6[uVar12];
        }
        if (puVar9 == puVar2 + uVar11) {
          return;
        }
        if (uVar13 == uVar3 - 1) {
          return;
        }
        puVar9 = puVar9 + 1;
LAB_002dd3ea:
        puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar1 + 1,puVar10 + uVar3,puVar9);
        uVar13 = (long)puVar10 - (long)prediction_data->Xc_ind >> 3;
      }
      else {
        if (uVar8 <= uVar12) goto LAB_002dd3ea;
        puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar9 + 1);
      }
      uVar11 = workspace->end;
    } while( true );
  }
  do {
    while( true ) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = workspace->end;
      if (puVar9 == puVar2 + sVar5 + 1) {
        return;
      }
      if (uVar13 == uVar3) {
        return;
      }
      uVar12 = *puVar9;
      if (uVar4 < uVar12) {
        return;
      }
      puVar10 = prediction_data->Xc_ind;
      puVar1 = puVar10 + uVar13;
      uVar11 = *puVar1;
      if (uVar11 == uVar12) break;
      if (uVar11 <= uVar12) goto LAB_002dd2b7;
      puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar9 + 1);
    }
    if ((!NAN(prediction_data->Xc[uVar13])) &&
       ((dVar14 = (double)prediction_data->Xc[uVar13], dVar14 < range_low || (range_high < dVar14)))
       ) {
      dVar14 = 1.0;
      if (weights_arr != (double *)0x0) {
        dVar14 = weights_arr[uVar12];
      }
      pdVar6 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6[uVar12] = pdVar6[uVar12] - dVar14;
    }
    if (puVar9 == puVar2 + sVar5) {
      return;
    }
    if (uVar13 == uVar3 - 1) {
      return;
    }
    puVar9 = puVar9 + 1;
LAB_002dd2b7:
    puVar10 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                        (puVar1 + 1,puVar10 + uVar3,puVar9);
    uVar13 = (long)puVar10 - (long)prediction_data->Xc_ind >> 3;
  } while( true );
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}